

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpressionResult.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptRegularExpressionResult::Create
          (void *stackAllocationPointer,JavascriptString *input,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  JavascriptArray *arr;
  undefined4 *puVar3;
  
  arr = JavascriptArray::New<Js::JavascriptArray,2u>
                  (stackAllocationPointer,0,
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->regexResultType).
                   ptr);
  bVar2 = Is(arr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x10,"(JavascriptRegularExpressionResult::Is(arr))",
                                "JavascriptRegularExpressionResult::Is(arr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicObject::SetSlot((DynamicObject *)arr,BuiltInPropertyRecords::input._8_4_,false,0,input);
  return arr;
}

Assistant:

JavascriptArray* JavascriptRegularExpressionResult::Create(
        void *const stackAllocationPointer,
        JavascriptString* input,
        ScriptContext* const scriptContext)
    {
        JavascriptArray* arr = JavascriptArray::New<JavascriptArray, InlineSlotCount>(stackAllocationPointer, 0, scriptContext->GetLibrary()->GetRegexResultType()); // use default array capacity

        Assert(JavascriptRegularExpressionResult::Is(arr));
        arr->SetSlot(SetSlotArguments(BuiltInPropertyRecords::input.propertyRecord.GetPropertyId(), InputIndex, input));

        // SetMatch must be called with a valid match before the object is given to script code
        // Each item will be filled in by the match loop
        return arr;
    }